

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostCoordinator.hpp
# Opt level: O0

void __thiscall
memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>::
copy<memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>
          (HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>> *this,
          ConstArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
          *from,ArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
                *to)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_pointer __first;
  const_pointer __last;
  pointer __result;
  ArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
  *to_local;
  ConstArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
  *from_local;
  HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_> *this_local;
  
  sVar2 = ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::size(from);
  sVar3 = ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
          ::size(to);
  if (sVar2 != sVar3) {
    __assert_fail("from.size()==to.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/HostCoordinator.hpp"
                  ,0x7b,
                  "void memory::HostCoordinator<int>::copy(const ConstArrayView<value_type, HostCoordinator<value_type, Allocator1>> &, ArrayView<value_type, HostCoordinator<value_type, Allocator2>> &) [T = int, Allocator = memory::Allocator<int, memory::impl::AlignedPolicy<8>>, Allocator1 = memory::Allocator<int, memory::impl::AlignedPolicy<8>>, Allocator2 = memory::Allocator<int, memory::impl::AlignedPolicy<8>>]"
                 );
  }
  bVar1 = ConstArrayViewImpl<memory::ConstArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
          ::
          overlaps<memory::ArrayViewImpl<memory::ArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>&,std::enable_if<true,void>>
                    ((ConstArrayViewImpl<memory::ConstArrayReference<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>,int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
                      *)from,to);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!from.overlaps(to)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/HostCoordinator.hpp"
                  ,0x7c,
                  "void memory::HostCoordinator<int>::copy(const ConstArrayView<value_type, HostCoordinator<value_type, Allocator1>> &, ArrayView<value_type, HostCoordinator<value_type, Allocator2>> &) [T = int, Allocator = memory::Allocator<int, memory::impl::AlignedPolicy<8>>, Allocator1 = memory::Allocator<int, memory::impl::AlignedPolicy<8>>, Allocator2 = memory::Allocator<int, memory::impl::AlignedPolicy<8>>]"
                 );
  }
  __first = ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
            ::begin(from);
  __last = ConstArrayViewImpl<memory::ConstArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
           ::end(from);
  __result = ArrayViewImpl<memory::ArrayReference<int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>,_int,_memory::HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>_>
             ::begin(to);
  std::copy<int_const*,int*>(__first,__last,__result);
  return;
}

Assistant:

void copy(const ConstArrayView<value_type, HostCoordinator<value_type, Allocator1>>& from,
                    ArrayView<value_type, HostCoordinator<value_type, Allocator2>>& to)
    {
        assert(from.size()==to.size());
        assert(!from.overlaps(to));

        #ifdef VERBOSE
        using c1 = HostCoordinator<value_type, Allocator1>;
        std::cerr << util::type_printer<c1>::print()
                  << "::" + util::blue("copy") << "(" << from.size()
                  << " [" << from.size()*sizeof(value_type) << " bytes])"
                  << " " << from.data() << util::yellow(" -> ") << to.data()
                  << std::endl;
        #endif

        std::copy(from.begin(), from.end(), to.begin());
    }